

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,uint u)

{
  bool bVar1;
  Number n;
  U local_10;
  double local_8;
  
  local_10.u._4_4_ = 0;
  local_10.u._0_4_ = u;
  local_8 = (double)local_10.i;
  bVar1 = WriteNumber(this,(Number *)&local_10);
  return bVar1;
}

Assistant:

bool Uint(unsigned u) { Number n; n.u.u = u; n.d = static_cast<double>(u); return WriteNumber(n); }